

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O1

void __thiscall
p2t::SweepContext::AddHole
          (SweepContext *this,vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline)

{
  pointer *pppPVar1;
  iterator __position;
  bool bVar2;
  pointer ppPVar3;
  ulong uVar4;
  ulong uVar5;
  
  InitEdges(this,polyline);
  ppPVar3 = (polyline->super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((polyline->super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppPVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      __position._M_current =
           (this->points_).super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->points_).super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<p2t::Point*,std::allocator<p2t::Point*>>::_M_realloc_insert<p2t::Point*const&>
                  ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)&this->points_,__position,
                   ppPVar3 + uVar4);
      }
      else {
        *__position._M_current = ppPVar3[uVar4];
        pppPVar1 = &(this->points_).super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      ppPVar3 = (polyline->super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      bVar2 = uVar5 < (ulong)((long)(polyline->
                                    super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3)
      ;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void SweepContext::AddHole(const std::vector<Point*>& polyline)
{
  InitEdges(polyline);
  for(unsigned int i = 0; i < polyline.size(); i++) {
    points_.push_back(polyline[i]);
  }
}